

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O1

void __thiscall DBaseDecal::CalcFracPos(DBaseDecal *this,side_t *wall,double x,double y)

{
  double dVar1;
  double dVar2;
  line_t_conflict *plVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  
  plVar3 = wall->linedef;
  bVar4 = plVar3->sidedef[0] == wall;
  dVar1 = **(double **)(plVar3->args + (ulong)!bVar4 * 2 + -0xb);
  dVar2 = (*(double **)(plVar3->args + (ulong)!bVar4 * 2 + -0xb))[1];
  dVar6 = **(double **)(plVar3->args + (ulong)bVar4 * 2 + -0xb) - dVar1;
  dVar5 = (*(double **)(plVar3->args + (ulong)bVar4 * 2 + -0xb))[1] - dVar2;
  if (ABS(dVar6) <= ABS(dVar5)) {
    dVar6 = 0.0;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      dVar6 = (y - dVar2) / dVar5;
    }
  }
  else {
    dVar6 = (x - dVar1) / dVar6;
  }
  this->LeftDistance = dVar6;
  return;
}

Assistant:

void DBaseDecal::CalcFracPos (side_t *wall, double x, double y)
{
	line_t *line = wall->linedef;
	vertex_t *v1, *v2;

	if (line->sidedef[0] == wall)
	{
		v1 = line->v1;
		v2 = line->v2;
	}
	else
	{
		v1 = line->v2;
		v2 = line->v1;
	}

	double dx = v2->fX() - v1->fX();
	double dy = v2->fY() - v1->fY();

	if (fabs(dx) > fabs(dy))
	{
		LeftDistance = (x - v1->fX()) / dx;
	}
	else if (dy != 0)
	{
		LeftDistance = (y - v1->fY()) / dy;
	}
	else
	{
		LeftDistance = 0;
	}
}